

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

BrandTypeIterator * __thiscall
wasm::anon_unknown_0::BrandTypeIterator::operator++(BrandTypeIterator *this)

{
  pointer *ppFVar1;
  pointer pFVar2;
  pointer pFVar3;
  FieldInfo *pFVar4;
  ulong uVar5;
  pointer pFVar6;
  int iVar7;
  ulong uVar8;
  FieldInfo *pFVar9;
  ulong uVar10;
  bool bVar11;
  
  pFVar2 = (this->fields).
           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (this->fields).
           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pFVar3 - (long)pFVar2 >> 1;
  uVar5 = uVar8 & 0xffffffff;
  while( true ) {
    uVar10 = uVar5;
    uVar5 = uVar10 - 1;
    if (uVar10 == 0) goto LAB_0098bc37;
    if (pFVar2[uVar5].immutable == false) break;
    pFVar2[uVar5].immutable = false;
    iVar7 = (uint)pFVar2[uVar5].index + ((pFVar2[uVar5].index + 1) / 9 & 0xfffffffe) * -9 + 1;
    pFVar2[uVar5].index = (uint8_t)iVar7;
    if ((short)iVar7 != 0) {
LAB_0098bc2e:
      if (uVar10 == 0) {
LAB_0098bc37:
        if (this->useArray == false) {
          if (pFVar3 == (this->fields).
                        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            if ((long)pFVar3 - (long)pFVar2 == 0x7ffffffffffffffe) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar5 = 1;
            if (pFVar3 != pFVar2) {
              uVar5 = uVar8;
            }
            uVar10 = uVar5 + uVar8;
            if (0x3ffffffffffffffe < uVar10) {
              uVar10 = 0x3fffffffffffffff;
            }
            if (CARRY8(uVar5,uVar8)) {
              uVar10 = 0x3fffffffffffffff;
            }
            if (uVar10 == 0) {
              pFVar4 = (FieldInfo *)0x0;
            }
            else {
              pFVar4 = (FieldInfo *)operator_new(uVar10 * 2);
            }
            pFVar4[uVar8].index = '\0';
            pFVar4[uVar8].immutable = false;
            pFVar9 = pFVar4;
            for (pFVar6 = pFVar2; pFVar3 != pFVar6; pFVar6 = pFVar6 + 1) {
              *pFVar9 = *pFVar6;
              pFVar9 = pFVar9 + 1;
            }
            if (pFVar2 != (pointer)0x0) {
              operator_delete(pFVar2,(long)(this->fields).
                                           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pFVar2);
            }
            (this->fields).
            super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = pFVar4;
            (this->fields).
            super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pFVar9 + 1;
            (this->fields).
            super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar4 + uVar10;
          }
          else {
            pFVar3->index = '\0';
            pFVar3->immutable = false;
            ppFVar1 = &(this->fields).
                       super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar1 = *ppFVar1 + 1;
          }
          bVar11 = (long)(this->fields).
                         super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->fields).
                         super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start == 2;
        }
        else {
          bVar11 = false;
        }
        this->useArray = bVar11;
      }
      return this;
    }
  }
  pFVar2[uVar5].immutable = true;
  goto LAB_0098bc2e;
}

Assistant:

BrandTypeIterator& operator++() {
    for (Index i = fields.size(); i > 0; --i) {
      if (fields[i - 1].advance()) {
        return *this;
      }
    }
    if (useArray) {
      useArray = false;
      return *this;
    }
    fields.emplace_back();
    useArray = fields.size() == 1;
    return *this;
  }